

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PassthroughTestInstance *this)

{
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkRenderPass renderPass_00;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  undefined8 uVar3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  RefData<vk::Handle<(vk::HandleType)17>_> data_03;
  RefData<vk::Handle<(vk::HandleType)23>_> data_04;
  RefData<vk::Handle<(vk::HandleType)16>_> data_05;
  RefData<vk::Handle<(vk::HandleType)24>_> data_06;
  RefData<vk::VkCommandBuffer_s_*> data_07;
  RefData<vk::Handle<(vk::HandleType)18>_> data_08;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  deUint32 dVar8;
  deUint32 height;
  VkPrimitiveTopology topology;
  VkImageLayout oldLayout;
  VkAccessFlags srcAccessMask;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  Allocation *pAVar9;
  undefined8 *puVar10;
  VkDeviceMemory memory;
  VkDeviceSize VVar11;
  size_t bufferSize;
  void *dst;
  const_reference src;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar12;
  Handle<(vk::HandleType)19> *pHVar13;
  VkBuffer *pVVar14;
  Handle<(vk::HandleType)22> *pHVar15;
  DescriptorSetUpdateBuilder *this_02;
  VkImage *pVVar16;
  Handle<(vk::HandleType)17> *pHVar17;
  Handle<(vk::HandleType)13> *pHVar18;
  Handle<(vk::HandleType)24> *pHVar19;
  TestContext *pTVar20;
  MessageBuilder *pMVar21;
  GraphicsPipelineBuilder *pGVar22;
  ProgramCollection<vk::ProgramBinary> *pPVar23;
  ProgramBinary *pPVar24;
  Handle<(vk::HandleType)16> *pHVar25;
  VkCommandBuffer_s **ppVVar26;
  Handle<(vk::HandleType)23> *pHVar27;
  Handle<(vk::HandleType)18> *pHVar28;
  size_type sVar29;
  TessPrimitiveType primitiveType;
  VkCommandPool commandPool;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  allocator<char> local_1109;
  string local_1108;
  byte local_10e3;
  byte local_10e2;
  allocator<char> local_10e1;
  string local_10e0;
  undefined1 local_10b9;
  undefined1 local_10b8 [7];
  bool ok;
  TestLog *local_f38;
  TestLog *log;
  bool ignoreOutOfBounds;
  IVec3 positionDeviation;
  UVec4 colorThreshold;
  ConstPixelBufferAccess image1;
  ConstPixelBufferAccess image0;
  undefined1 local_eb8 [8];
  VkBufferMemoryBarrier postCopyBarrier;
  undefined1 local_e30 [8];
  VkBufferImageCopy copyRegion;
  undefined1 local_dd8 [8];
  VkImageMemoryBarrier colorAttachmentPreCopyBarrier;
  undefined8 local_d88;
  VkDeviceSize vertexBufferOffset;
  deUint64 local_d78;
  VkRenderPass local_d70;
  undefined1 local_d68 [8];
  Vec4 clearColor;
  VkRect2D renderArea;
  undefined1 local_d28 [8];
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  VkAccessFlags srcFlags;
  VkImageLayout currentLayout;
  Move<vk::Handle<(vk::HandleType)18>_> local_cc8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_ca8;
  undefined1 local_c88 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  allocator<char> local_c11;
  string local_c10;
  TextureFormat local_bf0;
  undefined1 local_be8 [8];
  GraphicsPipelineBuilder pipelineBuilder;
  PipelineDescription *pipelineDescription;
  undefined1 local_ad0 [4];
  int pipelineNdx;
  MessageBuilder local_ab0;
  MessageBuilder local_930;
  TestLog *local_7b0;
  TestLog *log_1;
  Move<vk::VkCommandBuffer_s_*> local_7a0;
  RefData<vk::VkCommandBuffer_s_*> local_780;
  undefined1 local_760 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_720;
  undefined1 local_700 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_6d8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_6b8;
  undefined1 local_698 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_668;
  RefData<vk::Handle<(vk::HandleType)23>_> local_648;
  undefined1 local_628 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_5e8;
  undefined1 local_5c8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  Move<vk::Handle<(vk::HandleType)13>_> local_588;
  RefData<vk::Handle<(vk::HandleType)13>_> local_568;
  undefined1 local_548 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorAttachmentView;
  Buffer *colorBuffer [2];
  VkBufferCreateInfo local_508;
  undefined1 local_4d0 [8];
  Buffer colorBuffer2;
  VkBufferCreateInfo local_498;
  undefined1 local_460 [8];
  Buffer colorBuffer1;
  VkDeviceSize colorBufferSizeBytes;
  VkImageCreateInfo local_418;
  undefined1 local_3c0 [8];
  Image colorAttachmentImage;
  VkImageSubresourceRange colorImageSubresourceRange;
  VkFormat colorFormat;
  IVec2 renderSize;
  DescriptorSetUpdateBuilder local_360;
  deUint64 local_318;
  undefined1 local_310 [8];
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_2e8;
  RefData<vk::Handle<(vk::HandleType)22>_> local_2c8;
  undefined1 local_2a8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_270;
  RefData<vk::Handle<(vk::HandleType)21>_> local_250;
  undefined1 local_230 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_1c8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1a8;
  undefined1 local_188 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Allocation *alloc_1;
  VkBufferCreateInfo local_150;
  undefined1 local_118 [8];
  Buffer vertexBuffer;
  VkFormat vertexFormat;
  VkDeviceSize vertexDataSizeBytes;
  TessLevels *bufferTessLevels;
  Allocation *alloc;
  VkBufferCreateInfo local_a8;
  undefined1 local_70 [8];
  Buffer tessLevelsBuffer;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  PassthroughTestInstance *this_local;
  
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,3);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar4 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  tessLevelsBuffer.m_allocation.
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = allocator_00;
  makeBufferCreateInfo(&local_a8,0x18,0x20);
  tessellation::Buffer::Buffer
            ((Buffer *)local_70,vk_00,device_00,allocator_00,&local_a8,
             ::vk::MemoryRequirement::HostVisible);
  if (((this->m_params).useTessLevels & 1U) != 0) {
    pAVar9 = tessellation::Buffer::getAllocation((Buffer *)local_70);
    puVar10 = (undefined8 *)::vk::Allocation::getHostPtr(pAVar9);
    puVar10[2] = *(undefined8 *)((this->m_params).tessLevels.outer + 2);
    uVar3 = *(undefined8 *)(this->m_params).tessLevels.outer;
    *puVar10 = *(undefined8 *)(this->m_params).tessLevels.inner;
    puVar10[1] = uVar3;
    memory = ::vk::Allocation::getMemory(pAVar9);
    VVar11 = ::vk::Allocation::getOffset(pAVar9);
    ::vk::flushMappedMemoryRange(vk_00,device_00,memory,VVar11,0x18);
  }
  bufferSize = sizeInBytes<tcu::Vector<float,4>>(&(this->m_params).vertices);
  uVar3 = tessLevelsBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._12_4_ = 0x6d;
  makeBufferCreateInfo(&local_150,bufferSize,0x80);
  tessellation::Buffer::Buffer
            ((Buffer *)local_118,vk_00,device_00,(Allocator *)uVar3,&local_150,
             ::vk::MemoryRequirement::HostVisible);
  pAVar9 = tessellation::Buffer::getAllocation((Buffer *)local_118);
  dst = ::vk::Allocation::getHostPtr(pAVar9);
  src = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                  (&(this->m_params).vertices,0);
  ::deMemcpy(dst,src,bufferSize);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar9);
  VVar11 = ::vk::Allocation::getOffset(pAVar9);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,
             (VkDeviceMemory)
             descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
             m_allocator,VVar11,bufferSize);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  ::vk::DescriptorSetLayoutBuilder::build(&local_1c8,this_00,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1a8,(Move *)&local_1c8);
  data.deleter.m_deviceIface._0_4_ = (int)local_1a8.deleter.m_deviceIface;
  data.object.m_internal = local_1a8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1a8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_1a8.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_1a8.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_1a8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_1a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_188,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_1c8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_270,this_01,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_250,(Move *)&local_270);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_250.deleter.m_deviceIface;
  data_00.object.m_internal = local_250.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_250.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_250.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_250.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_250.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_250.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_230,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_270);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_230);
  descriptorPool_00.m_internal = pHVar12->m_internal;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_188);
  tessLevelsBufferInfo.range = pHVar13->m_internal;
  makeDescriptorSet(&local_2e8,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)tessLevelsBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2c8,(Move *)&local_2e8);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_2c8.deleter.m_deviceIface;
  data_01.object.m_internal = local_2c8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2c8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_2c8.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_2c8.deleter.m_device >> 0x20);
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_2c8.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_2c8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2a8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_2e8);
  pVVar14 = tessellation::Buffer::operator*((Buffer *)local_70);
  local_318 = pVVar14->m_internal;
  ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_310,(VkBuffer)local_318,0,0x18);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_360);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2a8);
  destSet.m_internal = pHVar15->m_internal;
  renderSize.m_data = (int  [2])::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_360,destSet,(Location *)&renderSize,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_310);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_360);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&colorImageSubresourceRange.layerCount,0x100,0x100);
  colorImageSubresourceRange.baseArrayLayer = 0x25;
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)
             &colorAttachmentImage.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,1,0,1,0,1);
  uVar3 = tessLevelsBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  makeImageCreateInfo(&local_418,(IVec2 *)&colorImageSubresourceRange.layerCount,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  tessellation::Image::Image
            ((Image *)local_3c0,vk_00,device_00,(Allocator *)uVar3,&local_418,
             ::vk::MemoryRequirement::Any);
  iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  iVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  colorBuffer1.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar7 = tcu::getPixelSize((TextureFormat)
                            colorBuffer1.m_allocation.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data._8_8_);
  uVar3 = tessLevelsBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  VVar11 = (VkDeviceSize)(iVar5 * iVar6 * iVar7);
  makeBufferCreateInfo(&local_498,VVar11,2);
  colorBuffer2.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._12_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_460,vk_00,device_00,(Allocator *)uVar3,&local_498,
             ::vk::MemoryRequirement::HostVisible);
  uVar3 = tessLevelsBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  makeBufferCreateInfo(&local_508,VVar11,2);
  tessellation::Buffer::Buffer
            ((Buffer *)local_4d0,vk_00,device_00,(Allocator *)uVar3,&local_508,
             ::vk::MemoryRequirement::HostVisible);
  colorAttachmentView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)local_460;
  pVVar16 = tessellation::Image::operator*((Image *)local_3c0);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  subresourceRange.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange.layerCount = colorImageSubresourceRange.levelCount;
  makeImageView(&local_588,vk_00,device_00,(VkImage)pVVar16->m_internal,VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_568,(Move *)&local_588);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_568.deleter.m_deviceIface;
  data_02.object.m_internal = local_568.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_568.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_568.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_568.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_568.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_568.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_548,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_588);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                 &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                  m_allocator,vk_00,device_00,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_5e8,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_5e8.deleter.m_deviceIface;
  data_03.object.m_internal = local_5e8.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5e8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_5e8.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_5e8.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_5e8.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_5e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_5c8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5c8);
  renderPass_00.m_internal = pHVar17->m_internal;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_548);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar18->m_internal;
  dVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  makeFramebuffer(&local_668,vk_00,device_00,renderPass_00,
                  (VkImageView)
                  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                  m_allocator,dVar8,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_648,(Move *)&local_668);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_648.deleter.m_deviceIface;
  data_04.object.m_internal = local_648.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_648.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_648.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_648.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_648.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_648.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_628,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_668);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_188);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar13->m_internal;
  makePipelineLayout(&local_6d8,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_6b8,(Move *)&local_6d8);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_6b8.deleter.m_deviceIface;
  data_05.object.m_internal = local_6b8.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_6b8.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_6b8.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_6b8.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_6b8.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_6b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_698,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_6d8);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,dVar4);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_720,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_720.deleter.m_deviceIface;
  data_06.object.m_internal = local_720.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_720.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_720.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_720.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_720.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_720.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_700,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_700);
  commandPool.m_internal = pHVar19->m_internal;
  log_1 = (TestLog *)commandPool.m_internal;
  ::vk::allocateCommandBuffer
            (&local_7a0,vk_00,device_00,commandPool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  primitiveType = (TessPrimitiveType)commandPool.m_internal;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_780,(Move *)&local_7a0);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_780.deleter.m_deviceIface;
  data_07.object = local_780.object;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_780.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_780.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_780.deleter.m_device >> 0x20);
  data_07.deleter.m_pool.m_internal._0_4_ = (int)local_780.deleter.m_pool.m_internal;
  data_07.deleter.m_pool.m_internal._4_4_ = (int)(local_780.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_760,data_07);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_7a0);
  pTVar20 = Context::getTestContext((this->super_TestInstance).m_context);
  local_7b0 = tcu::TestContext::getLog(pTVar20);
  tcu::TestLog::operator<<(&local_930,local_7b0,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar21 = tcu::MessageBuilder::operator<<(&local_930,&(this->m_params).message);
  tcu::MessageBuilder::operator<<(pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_930);
  if (((this->m_params).useTessLevels & 1U) != 0) {
    tcu::TestLog::operator<<(&local_ab0,local_7b0,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar21 = tcu::MessageBuilder::operator<<(&local_ab0,(char (*) [22])"Tessellation levels: ");
    getTessellationLevelsString_abi_cxx11_
              ((string *)local_ad0,(tessellation *)&(this->m_params).tessLevels,
               (TessLevels *)(ulong)(this->m_params).primitiveType,primitiveType);
    pMVar21 = tcu::MessageBuilder::operator<<
                        (pMVar21,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_ad0);
    tcu::MessageBuilder::operator<<(pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)local_ad0);
    tcu::MessageBuilder::~MessageBuilder(&local_ab0);
  }
  for (pipelineDescription._4_4_ = 0; pipelineDescription._4_4_ < 2;
      pipelineDescription._4_4_ = pipelineDescription._4_4_ + 1) {
    pipelineBuilder._256_8_ = (this->m_params).pipelineCases + pipelineDescription._4_4_;
    GraphicsPipelineBuilder::GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_be8);
    topology = getPrimitiveTopology((this->m_params).primitiveType);
    pGVar22 = GraphicsPipelineBuilder::setPrimitiveTopology
                        ((GraphicsPipelineBuilder *)local_be8,topology);
    pGVar22 = GraphicsPipelineBuilder::setRenderSize
                        (pGVar22,(IVec2 *)&colorImageSubresourceRange.layerCount);
    pGVar22 = GraphicsPipelineBuilder::setBlend(pGVar22,true);
    local_bf0 = ::vk::mapVkFormat(VK_FORMAT_R32G32B32A32_SFLOAT);
    dVar4 = tcu::getPixelSize(local_bf0);
    pGVar22 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                        (pGVar22,VK_FORMAT_R32G32B32A32_SFLOAT,dVar4);
    pGVar22 = GraphicsPipelineBuilder::setPatchControlPoints
                        (pGVar22,(this->m_params).inputPatchVertices);
    pPVar23 = Context::getBinaryCollection((this->super_TestInstance).m_context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c10,"vert",&local_c11);
    pPVar24 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar23,&local_c10);
    pGVar22 = GraphicsPipelineBuilder::setShader
                        (pGVar22,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar24,
                         (VkSpecializationInfo *)0x0);
    pPVar23 = Context::getBinaryCollection((this->super_TestInstance).m_context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c38,"frag",&local_c39);
    pPVar24 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar23,&local_c38);
    GraphicsPipelineBuilder::setShader
              (pGVar22,vk_00,device_00,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar24,
               (VkSpecializationInfo *)0x0);
    std::__cxx11::string::~string((string *)&local_c38);
    std::allocator<char>::~allocator(&local_c39);
    std::__cxx11::string::~string((string *)&local_c10);
    std::allocator<char>::~allocator(&local_c11);
    if ((*(byte *)pipelineBuilder._256_8_ & 1) != 0) {
      pPVar23 = Context::getBinaryCollection((this->super_TestInstance).m_context);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c60,"tesc",
                 (allocator<char> *)
                 ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                         m_allocator + 7));
      pPVar24 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar23,&local_c60);
      pGVar22 = GraphicsPipelineBuilder::setShader
                          ((GraphicsPipelineBuilder *)local_be8,vk_00,device_00,
                           VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar24,
                           (VkSpecializationInfo *)0x0);
      pPVar23 = Context::getBinaryCollection((this->super_TestInstance).m_context);
      pPVar24 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                          (pPVar23,(string *)(pipelineBuilder._256_8_ + 8));
      GraphicsPipelineBuilder::setShader
                (pGVar22,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar24,
                 (VkSpecializationInfo *)0x0);
      std::__cxx11::string::~string((string *)&local_c60);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                         m_allocator + 7));
    }
    if ((*(byte *)(pipelineBuilder._256_8_ + 1) & 1) != 0) {
      pPVar23 = Context::getBinaryCollection((this->super_TestInstance).m_context);
      pPVar24 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                          (pPVar23,(string *)(pipelineBuilder._256_8_ + 0x28));
      GraphicsPipelineBuilder::setShader
                ((GraphicsPipelineBuilder *)local_be8,vk_00,device_00,VK_SHADER_STAGE_GEOMETRY_BIT,
                 pPVar24,(VkSpecializationInfo *)0x0);
    }
    pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_698);
    pipelineLayout_00.m_internal = pHVar25->m_internal;
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5c8);
    GraphicsPipelineBuilder::build
              (&local_cc8,(GraphicsPipelineBuilder *)local_be8,vk_00,device_00,pipelineLayout_00,
               (VkRenderPass)pHVar17->m_internal);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_ca8,(Move *)&local_cc8);
    data_08.deleter.m_deviceIface._0_4_ = (int)local_ca8.deleter.m_deviceIface;
    data_08.object.m_internal = local_ca8.object.m_internal;
    data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ca8.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_device._0_4_ = (int)local_ca8.deleter.m_device;
    data_08.deleter.m_device._4_4_ = (int)((ulong)local_ca8.deleter.m_device >> 0x20);
    data_08.deleter.m_allocator._0_4_ = (int)local_ca8.deleter.m_allocator;
    data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_ca8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_c88,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_cc8);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    beginCommandBuffer(vk_00,*ppVVar26);
    oldLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
    if (pipelineDescription._4_4_ == 0) {
      oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    }
    srcAccessMask = (uint)(pipelineDescription._4_4_ != 0) << 0xb;
    colorAttachmentLayoutBarrier.subresourceRange.layerCount = srcAccessMask;
    colorAttachmentLayoutBarrier._68_4_ = oldLayout;
    pVVar16 = tessellation::Image::operator*((Image *)local_3c0);
    subresourceRange_00.levelCount = colorImageSubresourceRange.aspectMask;
    subresourceRange_00.aspectMask =
         colorAttachmentImage.m_allocation.
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
    subresourceRange_00.baseMipLevel =
         colorAttachmentImage.m_allocation.
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
    subresourceRange_00.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
    subresourceRange_00.layerCount = colorImageSubresourceRange.levelCount;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)local_d28,srcAccessMask,0x100,oldLayout,
               VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,(VkImage)pVVar16->m_internal,
               subresourceRange_00);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar26,0x1001,0x80,0,0,0,0,0,1,local_d28);
    clearColor.m_data._8_8_ = ::vk::makeOffset2D(0,0);
    dVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
    dVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
    ::vk::makeExtent2D(dVar4,dVar8);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_d68,0.0,0.0,0.0,1.0);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    commandBuffer = *ppVVar26;
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_5c8);
    local_d70.m_internal = pHVar17->m_internal;
    pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_628);
    local_d78 = pHVar27->m_internal;
    beginRenderPass(vk_00,commandBuffer,local_d70,(VkFramebuffer)local_d78,
                    (VkRect2D *)(clearColor.m_data + 2),(Vec4 *)local_d68);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    pVVar1 = *ppVVar26;
    pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_c88);
    vertexBufferOffset = pHVar28->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,0,vertexBufferOffset);
    local_d88 = 0;
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    pVVar1 = *ppVVar26;
    pVVar14 = tessellation::Buffer::get((Buffer *)local_118);
    (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,pVVar1,0,1,pVVar14,&local_d88);
    if (((this->m_params).useTessLevels & 1U) != 0) {
      ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
      pVVar1 = *ppVVar26;
      pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_698);
      colorAttachmentPreCopyBarrier._64_8_ = pHVar25->m_internal;
      pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                          ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2a8);
      (*vk_00->_vptr_DeviceInterface[0x56])
                (vk_00,pVVar1,0,colorAttachmentPreCopyBarrier._64_8_,0,1,(int)pHVar15,0,0);
    }
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    pVVar1 = *ppVVar26;
    sVar29 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&(this->m_params).vertices);
    (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,pVVar1,sVar29 & 0xffffffff,1,0);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    endRenderPass(vk_00,*ppVVar26);
    pVVar16 = tessellation::Image::operator*((Image *)local_3c0);
    copyRegion.imageExtent.height =
         colorAttachmentImage.m_allocation.
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
    copyRegion.imageExtent.depth =
         colorAttachmentImage.m_allocation.
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
    subresourceRange_01.levelCount = colorImageSubresourceRange.aspectMask;
    subresourceRange_01.aspectMask =
         colorAttachmentImage.m_allocation.
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
    subresourceRange_01.baseMipLevel =
         colorAttachmentImage.m_allocation.
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
    subresourceRange_01.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
    subresourceRange_01.layerCount = colorImageSubresourceRange.levelCount;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)local_dd8,0x100,0x800,
               VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
               (VkImage)pVVar16->m_internal,subresourceRange_01);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar26,0x400,0x1000,0,0,0,0,0,1,local_dd8);
    dVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
    dVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
    extent = ::vk::makeExtent3D(dVar4,dVar8,1);
    subresourceLayers = ::vk::makeImageSubresourceLayers(1,0,0,1);
    makeBufferImageCopy((VkBufferImageCopy *)local_e30,extent,subresourceLayers);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    pVVar1 = *ppVVar26;
    pVVar16 = tessellation::Image::operator*((Image *)local_3c0);
    dVar2 = pVVar16->m_internal;
    pVVar14 = tessellation::Buffer::get(colorBuffer[(long)pipelineDescription._4_4_ + -1]);
    postCopyBarrier.size = pVVar14->m_internal;
    (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar1,dVar2,6,postCopyBarrier.size,1,(int)local_e30);
    pVVar14 = tessellation::Buffer::get(colorBuffer[(long)pipelineDescription._4_4_ + -1]);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_eb8,0x1000,0x2000,(VkBuffer)pVVar14->m_internal,0,
               VVar11);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar26,0x1000,0x4000,0,0,0,1,(int)local_eb8,0,0);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    endCommandBuffer(vk_00,*ppVVar26);
    ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_760);
    submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar26);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_c88);
    GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_be8);
  }
  getPixelBufferAccess
            ((ConstPixelBufferAccess *)&image1.m_data,vk_00,device_00,
             (Buffer *)
             colorAttachmentView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
             m_allocator,VK_FORMAT_R8G8B8A8_UNORM,VVar11,
             (IVec2 *)&colorImageSubresourceRange.layerCount);
  getPixelBufferAccess
            ((ConstPixelBufferAccess *)(colorThreshold.m_data + 2),vk_00,device_00,
             (Buffer *)local_4d0,VK_FORMAT_R8G8B8A8_UNORM,VVar11,
             (IVec2 *)&colorImageSubresourceRange.layerCount);
  tcu::Vector<unsigned_int,_4>::Vector
            ((Vector<unsigned_int,_4> *)(positionDeviation.m_data + 1),8,8,8,0xff);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&log + 4),1,1,0);
  log._3_1_ = 1;
  pTVar20 = Context::getTestContext((this->super_TestInstance).m_context);
  local_f38 = tcu::TestContext::getLog(pTVar20);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_10b8,local_f38,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar21 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_10b8,(char (*) [22])"In image comparison:\n");
  pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(char (*) [15])"  Reference - ");
  pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,&(this->m_params).pipelineCases[0].description);
  pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(char (*) [2])0x1387264);
  pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(char (*) [15])"  Result    - ");
  pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,&(this->m_params).pipelineCases[1].description);
  pMVar21 = tcu::MessageBuilder::operator<<(pMVar21,(char (*) [2])0x1387264);
  tcu::MessageBuilder::operator<<(pMVar21,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_10b8);
  local_10b9 = tcu::intThresholdPositionDeviationCompare
                         (local_f38,"ImageCompare","Image comparison",
                          (ConstPixelBufferAccess *)&image1.m_data,
                          (ConstPixelBufferAccess *)(colorThreshold.m_data + 2),
                          (UVec4 *)(positionDeviation.m_data + 1),(IVec3 *)((long)&log + 4),true,
                          COMPARE_LOG_RESULT);
  local_10e2 = 0;
  local_10e3 = 0;
  if ((bool)local_10b9) {
    std::allocator<char>::allocator();
    local_10e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_10e0,"OK",&local_10e1);
    local_10e3 = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_10e0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1108,"Image comparison failed",&local_1109);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1108);
    std::__cxx11::string::~string((string *)&local_1108);
    std::allocator<char>::~allocator(&local_1109);
  }
  if ((local_10e3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_10e0);
  }
  if ((local_10e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_10e1);
  }
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_760);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_700);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_698);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_628);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_5c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_548);
  tessellation::Buffer::~Buffer((Buffer *)local_4d0);
  tessellation::Buffer::~Buffer((Buffer *)local_460);
  tessellation::Image::~Image((Image *)local_3c0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_230);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_188);
  tessellation::Buffer::~Buffer((Buffer *)local_118);
  tessellation::Buffer::~Buffer((Buffer *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus PassthroughTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER);
	DE_STATIC_ASSERT(PIPELINE_CASES == 2);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Tessellation levels
	const Buffer tessLevelsBuffer (vk, device, allocator, makeBufferCreateInfo(sizeof(TessLevels), VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	if (m_params.useTessLevels)
	{
		const Allocation& alloc = tessLevelsBuffer.getAllocation();
		TessLevels* const bufferTessLevels = static_cast<TessLevels*>(alloc.getHostPtr());
		*bufferTessLevels = m_params.tessLevels;
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
	}

	// Vertex attributes

	const VkDeviceSize	vertexDataSizeBytes = sizeInBytes(m_params.vertices);
	const VkFormat		vertexFormat		= VK_FORMAT_R32G32B32A32_SFLOAT;
	const Buffer		vertexBuffer		(vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &m_params.vertices[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
	}

	// Descriptors - make descriptor for tessellation levels, even if we don't use them, to simplify code

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet		   (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  tessLevelsBufferInfo = makeDescriptorBufferInfo(*tessLevelsBuffer, 0ull, sizeof(TessLevels));

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.update(vk, device);

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification.
	//                      We use two buffers, one for each case.

	const VkDeviceSize	colorBufferSizeBytes		= renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer1				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer		colorBuffer2				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer* const colorBuffer[PIPELINE_CASES] = { &colorBuffer1, &colorBuffer2 };

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Message explaining the test
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		log << tcu::TestLog::Message << m_params.message << tcu::TestLog::EndMessage;

		if (m_params.useTessLevels)
			log << tcu::TestLog::Message << "Tessellation levels: " << getTessellationLevelsString(m_params.tessLevels, m_params.primitiveType) << tcu::TestLog::EndMessage;
	}

	for (int pipelineNdx = 0; pipelineNdx < PIPELINE_CASES; ++pipelineNdx)
	{
		const PipelineDescription& pipelineDescription = m_params.pipelineCases[pipelineNdx];
		GraphicsPipelineBuilder	   pipelineBuilder;

		pipelineBuilder
			.setPrimitiveTopology		  (getPrimitiveTopology(m_params.primitiveType))
			.setRenderSize				  (renderSize)
			.setBlend					  (true)
			.setVertexInputSingleAttribute(vertexFormat, tcu::getPixelSize(mapVkFormat(vertexFormat)))
			.setPatchControlPoints		  (m_params.inputPatchVertices)
			.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
			.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				m_context.getBinaryCollection().get("frag"), DE_NULL);

		if (pipelineDescription.useTessellation)
			pipelineBuilder
				.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
				.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(pipelineDescription.tessEvalShaderName), DE_NULL);

		if (pipelineDescription.useGeometry)
			pipelineBuilder
				.setShader				  (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				m_context.getBinaryCollection().get(pipelineDescription.geomShaderName), DE_NULL);

		const Unique<VkPipeline> pipeline (pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

		// Draw commands

		beginCommandBuffer(vk, *cmdBuffer);

		// Change color attachment image layout
		{
			// State is slightly different on the first iteration.
			const VkImageLayout currentLayout = (pipelineNdx == 0 ? VK_IMAGE_LAYOUT_UNDEFINED : VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);
			const VkAccessFlags srcFlags	  = (pipelineNdx == 0 ? (VkAccessFlags)0          : (VkAccessFlags)VK_ACCESS_TRANSFER_READ_BIT);

			const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				srcFlags, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				currentLayout, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				*colorAttachmentImage, colorImageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT | VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
		}

		// Begin render pass
		{
			const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(renderSize.x(), renderSize.y()),
			};
			const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

			beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
		}

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		if (m_params.useTessLevels)
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(m_params.vertices.size()), 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		// Copy render result to a host-visible buffer
		{
			const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				*colorAttachmentImage, colorImageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
		}
		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, colorBuffer[pipelineNdx]->get(), 1u, &copyRegion);
		}
		{
			const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, colorBuffer[pipelineNdx]->get(), 0ull, colorBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results

	tcu::ConstPixelBufferAccess image0 = getPixelBufferAccess(vk, device, *colorBuffer[0], colorFormat, colorBufferSizeBytes, renderSize);
	tcu::ConstPixelBufferAccess image1 = getPixelBufferAccess(vk, device, *colorBuffer[1], colorFormat, colorBufferSizeBytes, renderSize);

	const tcu::UVec4 colorThreshold    (8, 8, 8, 255);
	const tcu::IVec3 positionDeviation (1, 1, 0);		// 3x3 search kernel
	const bool		 ignoreOutOfBounds = true;

	tcu::TestLog& log = m_context.getTestContext().getLog();
	log << tcu::TestLog::Message
		<< "In image comparison:\n"
		<< "  Reference - " << m_params.pipelineCases[0].description << "\n"
		<< "  Result    - " << m_params.pipelineCases[1].description << "\n"
		<< tcu::TestLog::EndMessage;

	const bool ok = tcu::intThresholdPositionDeviationCompare(
		log, "ImageCompare", "Image comparison", image0, image1, colorThreshold, positionDeviation, ignoreOutOfBounds, tcu::COMPARE_LOG_RESULT);

	return (ok ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
}